

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O0

void cdash_reporter_start_test(TestReporter *reporter,char *name)

{
  time_t tVar1;
  TestReporter *in_RSI;
  long in_RDI;
  CDashMemo *memo;
  char *in_stack_00000048;
  char *name_00;
  
  name_00 = *(char **)(in_RDI + 0x88);
  tVar1 = cdash_current_time(in_stack_00000048);
  *(time_t *)(name_00 + 0x38) = tVar1;
  reporter_start_test(in_RSI,name_00);
  return;
}

Assistant:

static void cdash_reporter_start_test(TestReporter *reporter, const char *name) {
    CDashMemo *memo = (CDashMemo *)reporter->memo;

    memo->teststarted = cdash_current_time(NULL);
    reporter_start_test(reporter, name);
}